

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_UnknownFieldPartialEqualTest_Test::TestBody
          (MessageDifferencerTest_UnknownFieldPartialEqualTest_Test *this)

{
  UnknownFieldSet *pUVar1;
  UnknownFieldSet *this_00;
  UnknownFieldSet *this_01;
  pointer pUVar2;
  char *in_R9;
  string_view value;
  string_view value_00;
  AssertHelper local_230;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_228;
  TestEmptyMessage empty2;
  TestEmptyMessage empty1;
  string local_1f0;
  AssertionResult gtest_ar_;
  MessageDifferencer differencer;
  
  proto2_unittest::TestEmptyMessage::TestEmptyMessage(&empty1);
  proto2_unittest::TestEmptyMessage::TestEmptyMessage(&empty2);
  pUVar1 = internal::InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                     (&empty1.super_ZeroFieldsBase.super_Message.super_MessageLite.
                       _internal_metadata_);
  this_00 = internal::InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                      (&empty2.super_ZeroFieldsBase.super_Message.super_MessageLite.
                        _internal_metadata_);
  UnknownFieldSet::AddVarint(pUVar1,0xf3,0x7a);
  value._M_str = "abc";
  value._M_len = 3;
  UnknownFieldSet::AddLengthDelimited(pUVar1,0xf5,value);
  this_01 = UnknownFieldSet::AddGroup(pUVar1,0xf6);
  UnknownFieldSet::AddFixed32(this_01,0xf8,1);
  pUVar2 = RepeatedField<google::protobuf::UnknownField>::Mutable(&pUVar1->fields_,2);
  pUVar1 = UnknownField::mutable_group(pUVar2);
  UnknownFieldSet::AddFixed32(pUVar1,0xf8,2);
  UnknownFieldSet::AddVarint(this_00,0xf3,0x7a);
  value_00._M_str = "abc";
  value_00._M_len = 3;
  UnknownFieldSet::AddLengthDelimited(this_00,0xf5,value_00);
  pUVar1 = UnknownFieldSet::AddGroup(this_00,0xf6);
  UnknownFieldSet::AddFixed32(pUVar1,0xf8,1);
  pUVar2 = RepeatedField<google::protobuf::UnknownField>::Mutable(&this_00->fields_,2);
  pUVar1 = UnknownField::mutable_group(pUVar2);
  UnknownFieldSet::AddFixed32(pUVar1,0xf8,2);
  util::MessageDifferencer::MessageDifferencer(&differencer);
  util::MessageDifferencer::set_scope(&differencer,PARTIAL);
  gtest_ar_.success_ =
       util::MessageDifferencer::Compare(&differencer,(Message *)&empty1,(Message *)&empty2);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f0,(internal *)&gtest_ar_,
               (AssertionResult *)"differencer.Compare(empty1, empty2)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x4da,local_1f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    std::__cxx11::string::~string((string *)&local_1f0);
    if (local_228._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_228._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  util::MessageDifferencer::~MessageDifferencer(&differencer);
  internal::ZeroFieldsBase::~ZeroFieldsBase(&empty2.super_ZeroFieldsBase);
  internal::ZeroFieldsBase::~ZeroFieldsBase(&empty1.super_ZeroFieldsBase);
  return;
}

Assistant:

TEST(MessageDifferencerTest, UnknownFieldPartialEqualTest) {
  unittest::TestEmptyMessage empty1;
  unittest::TestEmptyMessage empty2;

  UnknownFieldSet* unknown1 = empty1.mutable_unknown_fields();
  UnknownFieldSet* unknown2 = empty2.mutable_unknown_fields();

  unknown1->AddVarint(243, 122);
  unknown1->AddLengthDelimited(245, "abc");
  unknown1->AddGroup(246)->AddFixed32(248, 1);
  unknown1->mutable_field(2)->mutable_group()->AddFixed32(248, 2);

  unknown2->AddVarint(243, 122);
  unknown2->AddLengthDelimited(245, "abc");
  unknown2->AddGroup(246)->AddFixed32(248, 1);
  unknown2->mutable_field(2)->mutable_group()->AddFixed32(248, 2);

  util::MessageDifferencer differencer;
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_TRUE(differencer.Compare(empty1, empty2));
}